

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_signed_int_with_array(void)

{
  basic_variable<std::allocator<char>_> *local_128;
  undefined1 local_113;
  undefined1 local_112 [2];
  basic_variable<std::allocator<char>_> *local_110;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_a8 [93];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  int input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xce7,"void assign_suite::assign_signed_int_with_array()",local_4a,&local_4b);
  local_110 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_110,true);
  local_110 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_110,2);
  local_a8._0_8_ = &local_108;
  local_a8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_48,
             (basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a8 + 0x10));
  local_128 = (basic_variable<std::allocator<char>_> *)local_a8;
  do {
    local_128 = local_128 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_128);
  } while (local_128 != &local_108);
  local_112[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_48);
  local_113 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xce9,"void assign_suite::assign_signed_int_with_array()",local_112,&local_113);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void assign_signed_int_with_array()
{
    signed int input = 2;
    variable data(input);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
    data = { true, 2 };
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
}